

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O3

uchar GetArgumentRegister(ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,
                         RegVmLoweredBlock *lowBlock,VmValue *value)

{
  uchar uVar1;
  VmFunction *function;
  SmallArray<unsigned_char,_32U> result;
  
  if (value != (VmValue *)0x0) {
    if (value->typeID == 4) {
      uVar1 = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
      RegVmLoweredBlock::AddInstruction
                (lowBlock,ctx,value->source,rviFuncAddr,uVar1,'\0','\0',
                 *(uint *)((long)value[1]._vptr_VmValue + 0x44));
    }
    else {
      if (value->typeID != 1) goto LAB_00197fc1;
      result.allocator = ctx->allocator;
      result.data = result.little;
      result.count = 0;
      result.max = 0x20;
      LowerConstantIntoBlock(ctx,lowFunction,lowBlock,&result,value);
      if (result.count != 1) {
        __assert_fail("result.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x247,
                      "unsigned char GetArgumentRegister(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, VmValue *)"
                     );
      }
      uVar1 = *result.data;
      SmallArray<unsigned_char,_32U>::~SmallArray(&result);
    }
    return uVar1;
  }
LAB_00197fc1:
  uVar1 = RegVmLoweredFunction::GetRegister(lowFunction,value);
  return uVar1;
}

Assistant:

unsigned char GetArgumentRegister(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, VmValue *value)
{
	if(isType<VmConstant>(value))
	{
		SmallArray<unsigned char, 32> result(ctx.allocator);

		LowerConstantIntoBlock(ctx, lowFunction, lowBlock, result, value);

		assert(result.size() == 1);

		return result.back();
	}

	if(VmFunction *function = getType<VmFunction>(value))
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		lowBlock->AddInstruction(ctx, function->source, rviFuncAddr, targetReg, 0, 0, function->function->functionIndex);

		return targetReg;
	}

	return lowFunction->GetRegister(value);
}